

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

void __thiscall
QDoubleSpinBoxPrivate::emitSignals(QDoubleSpinBoxPrivate *this,EmitPolicy ep,QVariant *old)

{
  long lVar1;
  bool bVar2;
  QDoubleSpinBox *_t1;
  int in_ESI;
  QDoubleSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QDoubleSpinBox *q;
  QVariant *in_stack_ffffffffffffffa8;
  QDoubleSpinBox *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _t1 = q_func(in_RDI);
  if ((in_ESI != 2) &&
     ((*(ushort *)&(in_RDI->super_QAbstractSpinBoxPrivate).field_0x3d0 =
            *(ushort *)&(in_RDI->super_QAbstractSpinBoxPrivate).field_0x3d0 & 0xfffe, in_ESI == 1 ||
      (bVar2 = ::operator!=((QVariant *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), bVar2)
      ))) {
    QLineEdit::displayText((QLineEdit *)in_RDI);
    QDoubleSpinBox::textChanged(in_stack_ffffffffffffffb0,(QString *)_t1);
    QString::~QString((QString *)0x694568);
    ::QVariant::toDouble((bool *)&(in_RDI->super_QAbstractSpinBoxPrivate).value);
    QDoubleSpinBox::valueChanged((QDoubleSpinBox *)0x694591,(double)_t1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDoubleSpinBoxPrivate::emitSignals(EmitPolicy ep, const QVariant &old)
{
    Q_Q(QDoubleSpinBox);
    if (ep != NeverEmit) {
        pendingEmit = false;
        if (ep == AlwaysEmit || value != old) {
            emit q->textChanged(edit->displayText());
            emit q->valueChanged(value.toDouble());
        }
    }
}